

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  ushort key;
  uint8_t *puVar1;
  byte bVar2;
  uint uVar3;
  roaring_array_t *ra;
  container_t *pcVar4;
  ulong uVar5;
  roaring_bitmap_t *prVar6;
  ushort *puVar7;
  roaring_array_t *prVar8;
  uint uVar9;
  ulong uVar10;
  undefined7 in_register_00000011;
  long *c2;
  uint16_t key_00;
  roaring_array_t *sa;
  void **ppvVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint8_t result_type;
  uint8_t type1;
  uint8_t type2;
  uint8_t local_7b;
  byte local_7a;
  uint8_t local_79;
  roaring_array_t *local_78;
  roaring_array_t *local_70;
  long *local_68;
  roaring_array_t *local_60;
  ulong local_58;
  ulong local_50;
  undefined4 local_44;
  ulong local_40;
  undefined8 local_38;
  
  local_7b = '\0';
  uVar14 = (x1->high_low_container).size;
  local_50 = (ulong)uVar14;
  prVar6 = x2;
  if (uVar14 != 0) {
    uVar9 = (x2->high_low_container).size;
    prVar6 = x1;
    if (uVar9 != 0) {
      local_44 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      ra = &roaring_bitmap_create_with_capacity(uVar9 + uVar14)->high_low_container;
      bVar2 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar2 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar2;
      puVar7 = (x1->high_low_container).keys;
      key_00 = *(x2->high_low_container).keys;
      local_40 = (ulong)(uVar9 - 1);
      uVar10 = 0;
      uVar13 = 0;
      local_60 = &x1->high_low_container;
      local_58 = (ulong)uVar9;
LAB_00105f6c:
      do {
        uVar14 = (uint)uVar10;
        key = *puVar7;
        uVar13 = (ulong)(int)uVar13;
        while( true ) {
          sa = local_60;
          iVar12 = (int)uVar13;
          if (key == key_00) break;
          if (key < key_00) {
            local_7a = local_60->typecodes[uVar10 & 0xffff];
            local_70 = ra;
            pcVar4 = get_copy_of_container
                               (local_60->containers[uVar10 & 0xffff],&local_7a,
                                (_Bool)(local_60->flags & 1));
            ra = local_70;
            if ((sa->flags & 1) != 0) {
              local_60->containers[(int)uVar14] = pcVar4;
              local_60->typecodes[(int)uVar14] = local_7a;
            }
            ra_append(local_70,key,pcVar4,local_7a);
            uVar14 = uVar14 + 1;
            uVar10 = (ulong)uVar14;
            if (uVar14 != (uint)local_50) {
              puVar7 = (ushort *)((ulong)((uVar14 & 0xffff) * 2) + (long)local_60->keys);
              goto LAB_00105f6c;
            }
            uVar3 = (uint)local_58;
            goto LAB_00106407;
          }
          local_79 = (x2->high_low_container).typecodes[uVar13 & 0xffff];
          pcVar4 = get_copy_of_container
                             ((x2->high_low_container).containers[uVar13 & 0xffff],&local_79,
                              (_Bool)((x2->high_low_container).flags & 1));
          if (((x2->high_low_container).flags & 1) != 0) {
            (x2->high_low_container).containers[uVar13] = pcVar4;
            (x2->high_low_container).typecodes[uVar13] = local_79;
          }
          ra_append(ra,key_00,pcVar4,local_79);
          if ((int)local_40 == iVar12) {
            uVar3 = (uint)local_58;
            uVar13 = local_58 & 0xffffffff;
            uVar9 = (uint)local_50;
            sa = local_60;
            goto LAB_00106402;
          }
          uVar13 = uVar13 + 1;
          key_00 = (x2->high_low_container).keys[uVar13 & 0xffff];
        }
        local_7a = local_60->typecodes[uVar10 & 0xffff];
        uVar5 = CONCAT71((int7)((ulong)local_60->typecodes >> 8),local_7a);
        uVar9 = (uint)uVar5;
        prVar8 = (roaring_array_t *)local_60->containers[uVar10 & 0xffff];
        puVar1 = (x2->high_low_container).typecodes;
        local_79 = puVar1[uVar13 & 0xffff];
        uVar10 = CONCAT71((int7)((ulong)puVar1 >> 8),local_79);
        uVar3 = (uint)uVar10;
        ppvVar11 = (x2->high_low_container).containers;
        c2 = (long *)ppvVar11[uVar13 & 0xffff];
        if ((char)local_44 == '\0') {
LAB_00106053:
          if (local_7a == 4) {
            uVar9 = (uint)*(byte *)&prVar8->containers;
            prVar8 = *(roaring_array_t **)prVar8;
          }
          if (local_79 == '\x04') {
            uVar3 = (uint)*(byte *)(c2 + 1);
            c2 = (long *)*c2;
          }
          local_38 = 0;
          prVar6 = (roaring_bitmap_t *)
                   (*(code *)(&DAT_001254ec +
                             *(int *)(&DAT_001254ec +
                                     (ulong)(((uVar3 & 0xff) + (uVar9 & 0xff) * 4) - 5) * 4)))
                             (prVar8,ppvVar11,c2);
          return prVar6;
        }
        ppvVar11 = (void **)(uVar5 & 0xffffffff);
        if (local_7a == 4) {
          ppvVar11 = (void **)CONCAT71((int7)((ulong)ppvVar11 >> 8),
                                       *(undefined1 *)&prVar8->containers);
        }
        if ((char)ppvVar11 == '\x01') goto LAB_00106053;
        ppvVar11 = (void **)(uVar10 & 0xffffffff);
        if (local_79 == '\x04') {
          ppvVar11 = (void **)CONCAT71((int7)((ulong)ppvVar11 >> 8),(char)c2[1]);
        }
        if ((char)ppvVar11 == '\x01') goto LAB_00106053;
        if (local_7a == 4) {
          local_7a = *(byte *)&prVar8->containers;
          uVar9 = (uint)local_7a;
          prVar8 = *(roaring_array_t **)prVar8;
        }
        if ((char)uVar9 != '\x01') {
          local_68 = c2;
          if ((uVar9 & 0xff) == 3) {
            prVar8 = (roaring_array_t *)bitset_container_from_run((run_container_t *)prVar8);
            c2 = local_68;
          }
          else {
            prVar8 = (roaring_array_t *)bitset_container_from_array((array_container_t *)prVar8);
            c2 = local_68;
          }
        }
        local_7a = 1;
        local_70 = prVar8;
        prVar8 = (roaring_array_t *)container_lazy_ior(prVar8,'\x01',c2,local_79,&local_7b);
        if (prVar8 != local_70) {
          local_78 = prVar8;
          container_free(local_70,local_7a);
          prVar8 = local_78;
        }
        ra_append(ra,key,prVar8,local_7b);
        uVar14 = uVar14 + 1;
        uVar10 = (ulong)uVar14;
        uVar9 = (uint)local_50;
        if ((uVar14 == uVar9) || ((int)local_40 == iVar12)) {
          uVar13 = (ulong)(iVar12 + 1);
          uVar3 = (uint)local_58;
LAB_00106402:
          if (uVar14 == uVar9) {
LAB_00106407:
            bVar2 = (x2->high_low_container).flags;
            uVar14 = (uint)uVar13;
            sa = &x2->high_low_container;
            uVar9 = uVar3;
          }
          else {
            if ((uint)uVar13 != uVar3) {
              return (roaring_bitmap_t *)ra;
            }
            bVar2 = sa->flags;
          }
          ra_append_copy_range(ra,sa,uVar14,uVar9,(_Bool)(bVar2 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar13 = uVar13 + 1;
        puVar7 = (ushort *)((ulong)((uVar14 & 0xffff) * 2) + (long)sa->keys);
        key_00 = (x2->high_low_container).keys[(uint)uVar13 & 0xffff];
      } while( true );
    }
  }
  prVar6 = roaring_bitmap_copy(prVar6);
  return prVar6;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)) {
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2, &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}